

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O3

duckdb_state
duckdb_bind_parameter_index
          (duckdb_prepared_statement prepared_statement,idx_t *param_idx_out,char *name_p)

{
  bool bVar1;
  pointer pPVar2;
  size_t sVar3;
  duckdb_state dVar4;
  __node_base *p_Var5;
  string name;
  string local_48;
  
  dVar4 = DuckDBError;
  if ((prepared_statement != (duckdb_prepared_statement)0x0) &&
     (*(long *)(prepared_statement + 0x38) != 0)) {
    pPVar2 = duckdb::
             unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
             ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                           *)(prepared_statement + 0x38));
    bVar1 = duckdb::PreparedStatement::HasError(pPVar2);
    if ((!bVar1) && (param_idx_out != (idx_t *)0x0 && name_p != (char *)0x0)) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      sVar3 = strlen(name_p);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,name_p,name_p + sVar3);
      pPVar2 = duckdb::
               unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
               ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                             *)(prepared_statement + 0x38));
      p_Var5 = &(pPVar2->named_param_map)._M_h._M_before_begin;
      do {
        p_Var5 = p_Var5->_M_nxt;
        if (p_Var5 == (__node_base *)0x0) goto LAB_015e292b;
        bVar1 = duckdb::StringUtil::CIEquals((string *)(p_Var5 + 1),&local_48);
      } while (!bVar1);
      *param_idx_out = (idx_t)p_Var5[5]._M_nxt;
LAB_015e292b:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      dVar4 = (duckdb_state)(p_Var5 == (__node_base *)0x0);
    }
  }
  return dVar4;
}

Assistant:

duckdb_state duckdb_bind_parameter_index(duckdb_prepared_statement prepared_statement, idx_t *param_idx_out,
                                         const char *name_p) {
	auto wrapper = (PreparedStatementWrapper *)prepared_statement;
	if (!wrapper || !wrapper->statement || wrapper->statement->HasError()) {
		return DuckDBError;
	}
	if (!name_p || !param_idx_out) {
		return DuckDBError;
	}
	auto name = std::string(name_p);
	for (auto &pair : wrapper->statement->named_param_map) {
		if (duckdb::StringUtil::CIEquals(pair.first, name)) {
			*param_idx_out = pair.second;
			return DuckDBSuccess;
		}
	}
	return DuckDBError;
}